

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.C
# Opt level: O1

bool __thiscall Filter::excludeContent(Filter *this,string *line)

{
  bool bVar1;
  _List_node_base *p_Var2;
  
  p_Var2 = (this->m_exContent).
           super__List_base<std::unique_ptr<Regex,_std::default_delete<Regex>_>,_std::allocator<std::unique_ptr<Regex,_std::default_delete<Regex>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var2 == (_List_node_base *)&this->m_exContent) {
    bVar1 = false;
  }
  else {
    do {
      bVar1 = Regex::match((Regex *)p_Var2[1]._M_next,line,(Match *)0x0);
      if (bVar1) {
        return bVar1;
      }
      p_Var2 = p_Var2->_M_next;
    } while (p_Var2 != (_List_node_base *)&this->m_exContent);
  }
  return bVar1;
}

Assistant:

bool Filter::excludeContent(std::string const & line) const
{
    bool exclude = false;

    // Exclude filters
    Regex::PtrList::const_iterator it = m_exContent.begin();
    for (; !exclude && it != m_exContent.end(); ++it) {
        exclude = (*it)->match(line);
    }
    return exclude;
}